

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Grammar.cpp
# Opt level: O0

void __thiscall SGParser::Generator::Grammar::Clear(Grammar *this)

{
  Grammar *this_local;
  
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::clear(&this->GrammarSymbols);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear(&this->GrammarSymbolList);
  ClearProductions(this);
  this->ProductionCount = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear(&this->StartSymbols);
  std::
  map<unsigned_int,_SGParser::Generator::Grammar::TerminalPrec,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_SGParser::Generator::Grammar::TerminalPrec>_>_>
  ::clear(&this->Precedence);
  GrammarDebugData::Clear(&this->DebugData);
  return;
}

Assistant:

void Grammar::Clear() {
    GrammarSymbols.clear();
    GrammarSymbolList.clear();
    ClearProductions();
    ProductionCount = 0u;
    StartSymbols.clear();
    Precedence.clear();
    DebugData.Clear();
}